

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void GCTM(lua_State *L)

{
  unsigned_short *puVar1;
  byte bVar2;
  lu_byte lVar3;
  ushort uVar4;
  global_State *pgVar5;
  StkId pTVar6;
  Value *pVVar7;
  int iVar8;
  TValue *pTVar9;
  TValue v;
  Value local_30;
  ushort local_28;
  
  pgVar5 = L->l_G;
  if (pgVar5->gcemergency != '\0') {
    __assert_fail("!g->gcemergency",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x3eb,"void GCTM(lua_State *)");
  }
  local_30 = (Value)pgVar5->tobefnz;
  bVar2 = (local_30.gc)->marked;
  if ((bVar2 & 0x40) == 0) {
    __assert_fail("(((o)->marked) & ((1<<(6))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x3d4,"GCObject *udata2finalize(global_State *)");
  }
  pgVar5->tobefnz = (local_30.gc)->next;
  (local_30.gc)->next = pgVar5->allgc;
  pgVar5->allgc = (GCObject *)local_30;
  (local_30.gc)->marked = bVar2 & 0xbf;
  if ((byte)(pgVar5->gcstate - 3) < 4) {
    (local_30.gc)->marked = pgVar5->currentwhite & 0x18 | bVar2 & 0x87;
  }
  else if ((bVar2 & 7) == 3) {
    pgVar5->firstold1 = (GCObject *)local_30;
  }
  local_28 = (local_30.gc)->tt | 0x8000;
  pTVar9 = luaT_gettmbyobj(L,(TValue *)&local_30,TM_GC);
  if ((pTVar9 != (TValue *)0x0) && ((pTVar9->tt_ & 0xf) == 6)) {
    lVar3 = L->allowhook;
    bVar2 = pgVar5->gcstp;
    pgVar5->gcstp = bVar2 | 2;
    L->allowhook = '\0';
    pTVar6 = L->top;
    L->top = pTVar6 + 1;
    pTVar6->value_ = pTVar9->value_;
    uVar4 = pTVar9->tt_;
    pTVar6->tt_ = uVar4;
    if (((short)uVar4 < 0) &&
       (((uVar4 & 0x7f) != (ushort)((pTVar6->value_).gc)->tt ||
        ((L != (lua_State *)0x0 &&
         ((((pTVar6->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x3f4,"void GCTM(lua_State *)");
    }
    pVVar7 = &L->top->value_;
    L->top = (StkId)(pVVar7 + 2);
    pVVar7->gc = (GCObject *)local_30;
    *(ushort *)(pVVar7 + 1) = local_28;
    if (((short)local_28 < 0) &&
       (((local_28 & 0x7f) != (ushort)pVVar7->gc->tt ||
        ((L != (lua_State *)0x0 && ((pVVar7->gc->marked & (L->l_G->currentwhite ^ 0x18)) != 0))))))
    {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x3f5,"void GCTM(lua_State *)");
    }
    puVar1 = &L->ci->callstatus;
    *puVar1 = *puVar1 | 0x100;
    iVar8 = luaD_pcall(L,dothecall,(void *)0x0,(long)L->top + (-0x20 - (long)L->stack),0);
    puVar1 = &L->ci->callstatus;
    *puVar1 = *puVar1 & 0xfeff;
    L->allowhook = lVar3;
    pgVar5->gcstp = bVar2;
    if (iVar8 != 0) {
      L->top = L->top + -1;
    }
  }
  return;
}

Assistant:

static void GCTM (lua_State *L) {
  global_State *g = G(L);
  const TValue *tm;
  TValue v;
  lua_assert(!g->gcemergency);
  setgcovalue(L, &v, udata2finalize(g));
  tm = luaT_gettmbyobj(L, &v, TM_GC);
  if (tm != NULL && ttisfunction(tm)) {  /* is there a finalizer? */
    int status;
    lu_byte oldah = L->allowhook;
    int oldgcstp  = g->gcstp;
    g->gcstp |= GCSTPGC;  /* avoid GC steps */
    L->allowhook = 0;  /* stop debug hooks during GC metamethod */
    setobj2s(L, L->top++, tm);  /* push finalizer... */
    setobj2s(L, L->top++, &v);  /* ... and its argument */
    L->ci->callstatus |= CIST_FIN;  /* will run a finalizer */
    status = luaD_pcall(L, dothecall, NULL, savestack(L, L->top - 2), 0);
    L->ci->callstatus &= ~CIST_FIN;  /* not running a finalizer anymore */
    L->allowhook = oldah;  /* restore hooks */
    g->gcstp = oldgcstp;  /* restore state */
    if (unlikely(status != LUA_OK)) {  /* error while running __gc? */
      //luaE_warnerror(L, "__gc");
      L->top--;  /* pops error object */
    }
  }
}